

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

void google::protobuf::compiler::ruby::GenerateOneof(OneofDescriptor *oneof,Printer *printer)

{
  long lVar1;
  long lVar2;
  
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"oneof :$name$ do\n",(char (*) [5])0x3ea8a1,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(oneof + 8));
  io::Printer::Indent(printer);
  if (0 < *(int *)(oneof + 4)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      GenerateField((FieldDescriptor *)(*(long *)(oneof + 0x20) + lVar2),printer);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar1 < *(int *)(oneof + 4));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"end\n");
  return;
}

Assistant:

void GenerateOneof(const OneofDescriptor* oneof, io::Printer* printer) {
  printer->Print(
      "oneof :$name$ do\n",
      "name", oneof->name());
  printer->Indent();

  for (int i = 0; i < oneof->field_count(); i++) {
    const FieldDescriptor* field = oneof->field(i);
    GenerateField(field, printer);
  }

  printer->Outdent();
  printer->Print("end\n");
}